

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

any __thiscall
cs_impl::cni_helper<cs_impl::any_(*)(const_cs_impl::any_&),_cs_impl::any_(*)(const_cs_impl::any_&)>
::_call<0>(cni_helper<cs_impl::any_(*)(const_cs_impl::any_&),_cs_impl::any_(*)(const_cs_impl::any_&)>
           *this,vector *args,sequence<0> *param_3)

{
  reference val;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  any *in_RSI;
  proxy *in_RDI;
  any *in_stack_ffffffffffffffb8;
  any in_stack_ffffffffffffffd8;
  
  val = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,0);
  try_convert_and_check<const_cs_impl::any_&,_const_cs_impl::any_&,_cs_impl::any,_0UL>::convert(val)
  ;
  std::function<cs_impl::any_(const_cs_impl::any_&)>::operator()
            ((function<cs_impl::any_(const_cs_impl::any_&)> *)in_stack_ffffffffffffffd8.mDat,
             (any *)in_RDI);
  type_convertor<cs_impl::any,_cs_impl::any>::convert<cs_impl::any>((any *)&stack0xffffffffffffffd8)
  ;
  any::any(in_RSI,in_stack_ffffffffffffffb8);
  any::~any((any *)0x4d2518);
  return (any)in_RDI;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}